

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::DecimalNegateBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  byte bVar1;
  reference this_00;
  pointer pEVar2;
  reference this_01;
  LogicalType *type;
  LogicalType local_60;
  long *local_48;
  scalar_function_t local_40;
  
  make_uniq<duckdb::DecimalNegateBindData>();
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(arguments,0);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  type = &pEVar2->return_type;
  bVar1 = DecimalType::GetWidth(type);
  if (bVar1 < 5) {
    LogicalType::LogicalType(&local_60,SMALLINT);
    ScalarFunction::GetScalarUnaryFunction<duckdb::NegateOperator>(&local_40,&local_60);
  }
  else if (bVar1 < 10) {
    LogicalType::LogicalType(&local_60,INTEGER);
    ScalarFunction::GetScalarUnaryFunction<duckdb::NegateOperator>(&local_40,&local_60);
  }
  else if (bVar1 < 0x13) {
    LogicalType::LogicalType(&local_60,BIGINT);
    ScalarFunction::GetScalarUnaryFunction<duckdb::NegateOperator>(&local_40,&local_60);
  }
  else {
    LogicalType::LogicalType(&local_60,HUGEINT);
    ScalarFunction::GetScalarUnaryFunction<duckdb::NegateOperator>(&local_40,&local_60);
  }
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  operator=(&bound_function->function,&local_40);
  ::std::_Function_base::~_Function_base(&local_40.super__Function_base);
  LogicalType::~LogicalType(&local_60);
  LogicalType::Verify(type);
  this_01 = vector<duckdb::LogicalType,_true>::get<true>
                      (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,0)
  ;
  LogicalType::operator=(this_01,type);
  LogicalType::operator=(&(bound_function->super_BaseScalarFunction).return_type,type);
  *(undefined8 *)this = 0;
  if (local_48 != (long *)0x0) {
    (**(code **)(*local_48 + 8))();
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> DecimalNegateBind(ClientContext &context, ScalarFunction &bound_function,
                                           vector<unique_ptr<Expression>> &arguments) {

	auto bind_data = make_uniq<DecimalNegateBindData>();

	auto &decimal_type = arguments[0]->return_type;
	auto width = DecimalType::GetWidth(decimal_type);
	if (width <= Decimal::MAX_WIDTH_INT16) {
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<NegateOperator>(LogicalTypeId::SMALLINT);
	} else if (width <= Decimal::MAX_WIDTH_INT32) {
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<NegateOperator>(LogicalTypeId::INTEGER);
	} else if (width <= Decimal::MAX_WIDTH_INT64) {
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<NegateOperator>(LogicalTypeId::BIGINT);
	} else {
		D_ASSERT(width <= Decimal::MAX_WIDTH_INT128);
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<NegateOperator>(LogicalTypeId::HUGEINT);
	}
	decimal_type.Verify();
	bound_function.arguments[0] = decimal_type;
	bound_function.return_type = decimal_type;
	return nullptr;
}